

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebSocketFormat.h
# Opt level: O2

bool brynet::net::WebSocketFormat::wsFrameExtractBuffer
               (char *inbuffer,size_t bufferSize,string *payload,WebSocketFrameType *outopcode,
               size_t *frameSize,bool *outfin)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  size_t sVar4;
  uint8_t mask [4];
  long lStack_40;
  
  if (bufferSize < 2) {
    return false;
  }
  *outfin = (bool)((byte)*inbuffer >> 7);
  *outopcode = (byte)*inbuffer & 0xf;
  uVar1 = (byte)inbuffer[1] & 0x7f;
  if (uVar1 == 0x7e) {
    if (bufferSize < 4) {
      return false;
    }
    uVar1 = (uint)(byte)inbuffer[2] << 8;
    uVar2 = 4;
    lStack_40 = 3;
LAB_0013ea26:
    uVar1 = (byte)inbuffer[lStack_40] | uVar1;
  }
  else {
    if ((char)uVar1 == '\x7f') {
      if (bufferSize < 10) {
        return false;
      }
      if (inbuffer[2] != '\0') {
        return false;
      }
      if (inbuffer[3] != '\0') {
        return false;
      }
      if (inbuffer[4] != '\0') {
        return false;
      }
      if (inbuffer[5] != '\0') {
        return false;
      }
      if (inbuffer[6] < '\0') {
        return false;
      }
      uVar1 = (uint)(byte)inbuffer[8] << 8 |
              (uint)(byte)inbuffer[7] << 0x10 | (int)inbuffer[6] << 0x18;
      uVar2 = 10;
      lStack_40 = 9;
      goto LAB_0013ea26;
    }
    uVar2 = 2;
  }
  if (inbuffer[1] < '\0') {
    if (((ulong)uVar2 + 4 <= bufferSize) &&
       (sVar4 = (size_t)(uVar1 + (int)((ulong)uVar2 + 4)), sVar4 <= bufferSize)) {
      std::__cxx11::string::reserve((ulong)payload);
      for (uVar3 = 0; uVar1 != uVar3; uVar3 = uVar3 + 1) {
        std::__cxx11::string::push_back((char)payload);
      }
      goto LAB_0013eaa8;
    }
  }
  else {
    sVar4 = (size_t)(uVar2 + uVar1);
    if (sVar4 <= bufferSize) {
      std::__cxx11::string::append((char *)payload,(ulong)(inbuffer + uVar2));
LAB_0013eaa8:
      *frameSize = sVar4;
      return true;
    }
  }
  return false;
}

Assistant:

static bool wsFrameExtractBuffer(const char* inbuffer, 
                const size_t bufferSize, 
                std::string& payload, 
                WebSocketFrameType& outopcode, 
                size_t& frameSize, 
                bool& outfin)
            {
                const unsigned char* buffer = (const unsigned char*)inbuffer;

                if (bufferSize < 2)
                {
                    return false;
                }

                outfin = (buffer[0] & 0x80) != 0;
                outopcode = (WebSocketFrameType)(buffer[0] & 0x0F);
                const bool isMasking = (buffer[1] & 0x80) != 0;
                uint32_t payloadlen = buffer[1] & 0x7F;

                uint32_t pos = 2;
                if (payloadlen == 126)
                {
                    if (bufferSize < 4)
                    {
                        return false;
                    }

                    payloadlen = (buffer[2] << 8) + buffer[3];
                    pos = 4;
                }
                else if (payloadlen == 127)
                {
                    if (bufferSize < 10)
                    {
                        return false;
                    }

                    if (buffer[2] != 0 ||
                        buffer[3] != 0 ||
                        buffer[4] != 0 ||
                        buffer[5] != 0)
                    {
                        return false;
                    }

                    if ((buffer[6] & 0x80) != 0)
                    {
                        return false;
                    }

                    payloadlen = (buffer[6] << 24) + (buffer[7] << 16) + (buffer[8] << 8) + buffer[9];
                    pos = 10;
                }

                uint8_t mask[4];
                if (isMasking)
                {
                    if (bufferSize < (pos + 4))
                    {
                        return false;
                    }

                    mask[0] = buffer[pos++];
                    mask[1] = buffer[pos++];
                    mask[2] = buffer[pos++];
                    mask[3] = buffer[pos++];
                }

                if (bufferSize < (pos + payloadlen))
                {
                    return false;
                }

                if (isMasking)
                {
                    payload.reserve(payloadlen);
                    for (size_t i = pos, j = 0; j < payloadlen; i++, j++)
                        payload.push_back(buffer[i] ^ mask[j % 4]);
                }
                else
                {
                    payload.append((const char*)(buffer + pos), payloadlen);
                }

                frameSize = payloadlen + pos;

                return true;
            }